

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strfmt.c
# Opt level: O0

SBuf * lj_strfmt_putfnum_uint(SBuf *sb,SFormat sf,lua_Number n)

{
  SBuf *pSVar1;
  int64_t k;
  uint64_t in_stack_00000028;
  SFormat in_stack_00000034;
  SBuf *in_stack_00000038;
  
  pSVar1 = lj_strfmt_putfxint(in_stack_00000038,in_stack_00000034,in_stack_00000028);
  return pSVar1;
}

Assistant:

SBuf *lj_strfmt_putfnum_uint(SBuf *sb, SFormat sf, lua_Number n)
{
  int64_t k;
  if (n >= 9223372036854775808.0)
    k = (int64_t)(n - 18446744073709551616.0);
  else
    k = (int64_t)n;
  return lj_strfmt_putfxint(sb, sf, (uint64_t)k);
}